

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

path * GetAuthCookieFile(bool temp)

{
  long lVar1;
  byte in_SIL;
  path *in_RDI;
  long in_FS_OFFSET;
  path arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff40;
  path *this;
  undefined1 net_specific;
  path *in_stack_ffffffffffffff60;
  ArgsManager *in_stack_ffffffffffffff68;
  path *__a;
  string *in_stack_ffffffffffffff80;
  ArgsManager *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  net_specific = (undefined1)((ulong)&stack0xffffffffffffff87 >> 0x38);
  this = in_RDI;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,(allocator<char> *)__a);
  fs::path::path((path *)0xe452ab,(char *)in_stack_ffffffffffffff38);
  ArgsManager::GetPathArg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(path *)__a);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(in_stack_ffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  if ((in_SIL & 1) != 0) {
    std::filesystem::__cxx11::path::operator+=(this,in_stack_ffffffffffffff40);
  }
  AbsPathForConfigVal(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(bool)net_specific);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetAuthCookieFile(bool temp=false)
{
    fs::path arg = gArgs.GetPathArg("-rpccookiefile", COOKIEAUTH_FILE);
    if (temp) {
        arg += ".tmp";
    }
    return AbsPathForConfigVal(gArgs, arg);
}